

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::PulseStyleDeclarationSyntax::setChild
          (PulseStyleDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_0025c310 + *(int *)(&DAT_0025c310 + index * 4)))
            (&child,index,in_RDX,&DAT_0025c310 + *(int *)(&DAT_0025c310 + index * 4));
  return;
}

Assistant:

void PulseStyleDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: inputs = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}